

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WAsmjsUtils.cpp
# Opt level: O0

void __thiscall WAsmJs::TypedRegisterAllocator::DumpLocalsInfo(TypedRegisterAllocator *this)

{
  bool bVar1;
  RegSlot RVar2;
  RegSlot RVar3;
  RegSlot RVar4;
  RegisterSpace *this_00;
  RegisterSpace *registerSpace;
  char16 shortTypeName [16];
  char16 typeName [16];
  Types type;
  int i;
  TypedRegisterAllocator *this_local;
  
  typeName[0xe] = L'\0';
  typeName[0xf] = L'\0';
  for (; (int)typeName._28_4_ < 5; typeName._28_4_ = typeName._28_4_ + 1) {
    bVar1 = IsTypeExcluded(this,typeName._28_4_);
    if (!bVar1) {
      RegisterSpace::GetTypeDebugName(typeName._28_4_,shortTypeName + 0xc,0x10,false);
      RegisterSpace::GetTypeDebugName(typeName._28_4_,(char16 *)&registerSpace,0x10,true);
      this_00 = GetRegisterSpace(this,typeName._28_4_);
      RVar2 = RegisterSpace::GetVarCount(this_00);
      RVar3 = RegisterSpace::GetTmpCount(this_00);
      RVar4 = RegisterSpace::GetFirstTmpRegister(this_00);
      Output::Print(L"     %-10s : %u locals (%u temps from %s%u)\n",shortTypeName + 0xc,
                    (ulong)RVar2,(ulong)RVar3,&registerSpace,(ulong)RVar4);
    }
  }
  return;
}

Assistant:

void TypedRegisterAllocator::DumpLocalsInfo() const
    {
        for (int i = 0; i < WAsmJs::LIMIT; ++i)
        {
            Types type = (Types)i;
            if (!IsTypeExcluded(type))
            {
                char16 typeName[16];
                char16 shortTypeName[16];
                RegisterSpace::GetTypeDebugName(type, typeName, 16);
                RegisterSpace::GetTypeDebugName(type, shortTypeName, 16, true);
                RegisterSpace* registerSpace = GetRegisterSpace(type);
                Output::Print(
                    _u("     %-10s : %u locals (%u temps from %s%u)\n"),
                    typeName,
                    registerSpace->GetVarCount(),
                    registerSpace->GetTmpCount(),
                    shortTypeName,
                    registerSpace->GetFirstTmpRegister());
            }
        }
    }